

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::
GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
          (java *this,string *package_dir,string *java_package,Descriptor *descriptor,
          GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,bool annotate_code,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_list,string *name_suffix,MessageGenerator *generator,
          offset_in_MessageGenerator_to_subr pfn)

{
  long *plVar1;
  ZeroCopyOutputStream *output;
  ZeroCopyOutputStream *output_00;
  char **ppcVar2;
  size_type *psVar3;
  AnnotationCollector *annotation_collector_00;
  undefined7 in_stack_00000009;
  string info_full_path;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  Printer printer;
  char local_164;
  value_type local_160;
  string *local_140;
  string *local_138;
  value_type local_130;
  AnnotationCollector local_110;
  GeneratedCodeInfo *local_108;
  GeneratedCodeInfo local_100;
  Printer local_d0;
  
  local_140 = java_package;
  local_138 = package_dir;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (java_package->_M_dataplus)._M_p);
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_100,
                              (ulong)(annotation_list->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
  ppcVar2 = (char **)(plVar1 + 2);
  if ((char **)*plVar1 == ppcVar2) {
    local_d0.buffer_ = *ppcVar2;
    local_d0._24_8_ = plVar1[3];
    local_d0._0_8_ = &local_d0.buffer_;
  }
  else {
    local_d0.buffer_ = *ppcVar2;
    local_d0._0_8_ = (char **)*plVar1;
  }
  local_d0.output_ = (ZeroCopyOutputStream *)plVar1[1];
  *plVar1 = (long)ppcVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append(&local_d0.variable_delimiter_);
  psVar3 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_160.field_2._M_allocated_capacity = *psVar3;
    local_160.field_2._8_8_ = plVar1[3];
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar3;
    local_160._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_160._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((char **)local_d0._0_8_ != &local_d0.buffer_) {
    operator_delete((void *)local_d0._0_8_);
  }
  if (local_100.super_Message.super_MessageLite._vptr_MessageLite !=
      (MessageLite)&local_100._has_bits_) {
    operator_delete((void *)local_100.super_Message.super_MessageLite._vptr_MessageLite);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)context,&local_160);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_160._M_dataplus._M_p,
             local_160._M_dataplus._M_p + local_160._M_string_length);
  std::__cxx11::string::append((char *)&local_130);
  GeneratedCodeInfo::GeneratedCodeInfo(&local_100);
  local_110._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_0046c7a0;
  local_108 = &local_100;
  output = (ZeroCopyOutputStream *)(**(code **)(*(long *)descriptor + 0x10))(descriptor,&local_160);
  local_164 = (char)file_list;
  annotation_collector_00 = &local_110;
  if (local_164 == '\0') {
    annotation_collector_00 = (AnnotationCollector *)0x0;
  }
  io::Printer::Printer(&local_d0,output,'$',annotation_collector_00);
  io::Printer::Print<char[9],std::__cxx11::string>
            (&local_d0,
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
             ,(char (*) [9])"filename",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             **(undefined8 **)&local_140->field_2);
  if (local_138->_M_string_length != 0) {
    io::Printer::Print<char[8],std::__cxx11::string>
              (&local_d0,"package $package$;\n\n",(char (*) [8])0x3b2c8e,local_138);
  }
  plVar1 = (long *)((long)&(name_suffix->_M_dataplus)._M_p + pfn);
  if (((ulong)generator & 1) != 0) {
    generator = *(MessageGenerator **)(*plVar1 + -1 + (long)generator);
  }
  (*(code *)generator)(plVar1,&local_d0);
  if (local_164 != '\0') {
    output_00 = (ZeroCopyOutputStream *)
                (**(code **)(*(long *)descriptor + 0x10))(descriptor,&local_130);
    MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_100,output_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT71(in_stack_00000009,annotate_code),&local_130);
    if (output_00 != (ZeroCopyOutputStream *)0x0) {
      (*output_00->_vptr_ZeroCopyOutputStream[1])(output_00);
    }
  }
  io::Printer::~Printer(&local_d0);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void GenerateSibling(
    const std::string& package_dir, const std::string& java_package,
    const DescriptorClass* descriptor, GeneratorContext* context,
    std::vector<std::string>* file_list, bool annotate_code,
    std::vector<std::string>* annotation_list, const std::string& name_suffix,
    GeneratorClass* generator,
    void (GeneratorClass::*pfn)(io::Printer* printer)) {
  std::string filename =
      package_dir + descriptor->name() + name_suffix + ".java";
  file_list->push_back(filename);
  std::string info_full_path = filename + ".pb.meta";
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);

  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  io::Printer printer(output.get(), '$',
                      annotate_code ? &annotation_collector : NULL);

  printer.Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n",
      "filename", descriptor->file()->name());
  if (!java_package.empty()) {
    printer.Print(
        "package $package$;\n"
        "\n",
        "package", java_package);
  }

  (generator->*pfn)(&printer);

  if (annotate_code) {
    std::unique_ptr<io::ZeroCopyOutputStream> info_output(
        context->Open(info_full_path));
    annotations.SerializeToZeroCopyStream(info_output.get());
    annotation_list->push_back(info_full_path);
  }
}